

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O0

void anon_unknown.dwarf_208998::gcm_siv_polyval
               (uint8_t *out_tag,uint8_t *in,size_t in_len,uint8_t *ad,size_t ad_len,
               uint8_t *auth_key,uint8_t *nonce)

{
  ulong local_180;
  size_t i;
  uint8_t length_block [16];
  uint8_t scratch [16];
  polyval_ctx polyval_ctx;
  uint8_t *auth_key_local;
  size_t ad_len_local;
  uint8_t *ad_local;
  size_t in_len_local;
  uint8_t *in_local;
  uint8_t *out_tag_local;
  
  crypto_polyval_init((polyval_ctx *)(scratch + 8),auth_key);
  crypto_polyval_update_blocks((polyval_ctx *)(scratch + 8),ad,ad_len & 0xfffffffffffffff0);
  if ((ad_len & 0xf) != 0) {
    ::OPENSSL_memset(length_block + 8,0,0x10);
    ::OPENSSL_memcpy(length_block + 8,ad + (ad_len & 0xfffffffffffffff0),ad_len & 0xf);
    crypto_polyval_update_blocks((polyval_ctx *)(scratch + 8),length_block + 8,0x10);
  }
  crypto_polyval_update_blocks((polyval_ctx *)(scratch + 8),in,in_len & 0xfffffffffffffff0);
  if ((in_len & 0xf) != 0) {
    ::OPENSSL_memset(length_block + 8,0,0x10);
    ::OPENSSL_memcpy(length_block + 8,in + (in_len & 0xfffffffffffffff0),in_len & 0xf);
    crypto_polyval_update_blocks((polyval_ctx *)(scratch + 8),length_block + 8,0x10);
  }
  CRYPTO_store_u64_le(&i,ad_len << 3);
  CRYPTO_store_u64_le(length_block,in_len << 3);
  crypto_polyval_update_blocks((polyval_ctx *)(scratch + 8),(uint8_t *)&i,0x10);
  crypto_polyval_finish((polyval_ctx *)(scratch + 8),out_tag);
  for (local_180 = 0; local_180 < 0xc; local_180 = local_180 + 1) {
    out_tag[local_180] = out_tag[local_180] ^ nonce[local_180];
  }
  out_tag[0xf] = out_tag[0xf] & 0x7f;
  return;
}

Assistant:

void gcm_siv_polyval(uint8_t out_tag[16], const uint8_t *in, size_t in_len,
                     const uint8_t *ad, size_t ad_len,
                     const uint8_t auth_key[16],
                     const uint8_t nonce[EVP_AEAD_AES_GCM_SIV_NONCE_LEN]) {
  struct polyval_ctx polyval_ctx;
  crypto_polyval_init(&polyval_ctx, auth_key);

  crypto_polyval_update_blocks(&polyval_ctx, ad, ad_len & ~15);

  uint8_t scratch[16];
  if (ad_len & 15) {
    OPENSSL_memset(scratch, 0, sizeof(scratch));
    OPENSSL_memcpy(scratch, &ad[ad_len & ~15], ad_len & 15);
    crypto_polyval_update_blocks(&polyval_ctx, scratch, sizeof(scratch));
  }

  crypto_polyval_update_blocks(&polyval_ctx, in, in_len & ~15);
  if (in_len & 15) {
    OPENSSL_memset(scratch, 0, sizeof(scratch));
    OPENSSL_memcpy(scratch, &in[in_len & ~15], in_len & 15);
    crypto_polyval_update_blocks(&polyval_ctx, scratch, sizeof(scratch));
  }

  uint8_t length_block[16];
  CRYPTO_store_u64_le(length_block, ((uint64_t)ad_len) * 8);
  CRYPTO_store_u64_le(length_block + 8, ((uint64_t)in_len) * 8);
  crypto_polyval_update_blocks(&polyval_ctx, length_block,
                               sizeof(length_block));

  crypto_polyval_finish(&polyval_ctx, out_tag);
  for (size_t i = 0; i < EVP_AEAD_AES_GCM_SIV_NONCE_LEN; i++) {
    out_tag[i] ^= nonce[i];
  }
  out_tag[15] &= 0x7f;
}